

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall
DPolyobjInterpolation::DPolyobjInterpolation(DPolyobjInterpolation *this,FPolyObj *po)

{
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_008694b0;
  (this->oldverts).Array = (double *)0x0;
  (this->oldverts).Most = 0;
  (this->oldverts).Count = 0;
  (this->bakverts).Array = (double *)0x0;
  (this->bakverts).Most = 0;
  (this->bakverts).Count = 0;
  this->poly = po;
  TArray<double,_double>::Resize(&this->oldverts,(po->Vertices).Count * 2);
  TArray<double,_double>::Resize(&this->bakverts,(po->Vertices).Count * 2);
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])(this);
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DPolyobjInterpolation::DPolyobjInterpolation(FPolyObj *po)
{
	poly = po;
	oldverts.Resize(po->Vertices.Size() << 1);
	bakverts.Resize(po->Vertices.Size() << 1);
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}